

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

AppendResult __thiscall
metaf::WindGroup::appendWindShift(WindGroup *this,string *group,ReportMetadata *reportMetadata)

{
  bool bVar1;
  uint uVar2;
  MetafTime *this_00;
  long lVar3;
  WindGroup *in_RDI;
  uint minute;
  uint hour;
  optional<unsigned_int> hourMinuteVal;
  optional<unsigned_int> minuteVal;
  uint in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff4c;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffff58;
  uint in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined8 in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  optional<metaf::MetafTime> local_48;
  optional<metaf::MetafTime> local_34 [2];
  AppendResult local_4;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                          (char *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (bVar1) {
    in_RDI->windType = WIND_SHIFT_FROPA;
    local_4 = APPENDED;
  }
  else {
    eventTime(local_34,in_RDI);
    bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241a30);
    if (bVar1) {
      local_4 = NOT_APPENDED;
    }
    else {
      eventTime(&local_48,in_RDI);
      bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241a5f);
      in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c & 0xffffff;
      if (!bVar1) {
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241a7d);
        in_stack_ffffffffffffff5c = in_stack_ffffffffffffff5c & 0xffffff;
        if (bVar1) {
          lVar3 = std::__cxx11::string::length();
          in_stack_ffffffffffffff5c = CONCAT13(lVar3 == 2,(int3)in_stack_ffffffffffffff5c);
        }
      }
      if ((char)(in_stack_ffffffffffffff5c >> 0x18) == '\0') {
        eventTime((optional<metaf::MetafTime> *)&stack0xffffffffffffff8c,in_RDI);
        bVar1 = std::optional<metaf::MetafTime>::has_value((optional<metaf::MetafTime> *)0x241b5d);
        uVar4 = false;
        if (!bVar1) {
          lVar3 = std::__cxx11::string::length();
          uVar4 = lVar3 == 4;
        }
        if ((bool)uVar4 == false) {
          local_4 = NOT_APPENDED;
        }
        else {
          strToUint(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
          bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x241bb4);
          if (bVar1) {
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x241bcf);
            std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x241be8);
            MetafTime::MetafTime
                      ((MetafTime *)CONCAT17(uVar4,in_stack_ffffffffffffff50),
                       in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
            std::optional<metaf::MetafTime>::operator=
                      ((optional<metaf::MetafTime> *)in_RDI,
                       (MetafTime *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
            local_4 = APPENDED;
          }
          else {
            local_4 = NOT_APPENDED;
          }
        }
      }
      else {
        strToUint(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
        bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x241ad6);
        if (bVar1) {
          this_00 = std::optional<metaf::MetafTime>::operator->
                              ((optional<metaf::MetafTime> *)0x241afb);
          uVar2 = MetafTime::hour(this_00);
          std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x241b11);
          MetafTime::MetafTime
                    ((MetafTime *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                     in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48);
          std::optional<metaf::MetafTime>::operator=
                    ((optional<metaf::MetafTime> *)in_RDI,
                     (MetafTime *)CONCAT44(in_stack_ffffffffffffff5c,uVar2));
          local_4 = APPENDED;
        }
        else {
          local_4 = NOT_APPENDED;
        }
      }
    }
  }
  return local_4;
}

Assistant:

AppendResult WindGroup::appendWindShift(const std::string & group,
	const ReportMetadata & reportMetadata)
{
	//Append FROPA to wind shift group with or without time
	if (group == "FROPA") {
		windType = Type::WIND_SHIFT_FROPA;
		return AppendResult::APPENDED;
	}
	if (eventTime().has_value()) return AppendResult::NOT_APPENDED;
	//Append 2-digit time to WSHFT
	if (!eventTime().has_value() &&
		reportMetadata.reportTime.has_value() &&
		group.length() == 2)
	{
		const auto minuteVal = strToUint(group, 0, 2);
		if (!minuteVal.has_value()) return AppendResult::NOT_APPENDED;
		evTime = MetafTime(reportMetadata.reportTime->hour(), *minuteVal);
		return AppendResult::APPENDED;
	}
	//Append 4-digit time to WSHFT
	if (!eventTime().has_value() && group.length() == 4)
	{
		const auto hourMinuteVal = strToUint(group, 0, 4);
		if (!hourMinuteVal.has_value()) return AppendResult::NOT_APPENDED;
		// hourMinuteVal.value() has 4 digits, format hhmm
		const auto hour = *hourMinuteVal / 100;
		const auto minute = *hourMinuteVal % 100;
		evTime = MetafTime (hour, minute);
		return AppendResult::APPENDED;
	}
	return AppendResult::NOT_APPENDED;
}